

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2test.c
# Opt level: O0

int ord2utf8(uint32_t cvalue,uint8_t *utf8bytes)

{
  int local_20;
  int local_1c;
  int j;
  int i;
  uint8_t *utf8bytes_local;
  uint32_t cvalue_local;
  
  if (cvalue < 0x80000000) {
    for (local_1c = 0; (local_1c < 6 && ((uint)utf8_table1[local_1c] < cvalue));
        local_1c = local_1c + 1) {
    }
    _j = utf8bytes + local_1c;
    utf8bytes_local._0_4_ = cvalue;
    for (local_20 = local_1c; 0 < local_20; local_20 = local_20 + -1) {
      *_j = (byte)(uint32_t)utf8bytes_local & 0x3f | 0x80;
      utf8bytes_local._0_4_ = (uint32_t)utf8bytes_local >> 6;
      _j = _j + -1;
    }
    *_j = (byte)utf8_table2[local_1c] | (byte)(uint32_t)utf8bytes_local;
    utf8bytes_local._4_4_ = local_1c + 1;
  }
  else {
    utf8bytes_local._4_4_ = -1;
  }
  return utf8bytes_local._4_4_;
}

Assistant:

static int
ord2utf8(uint32_t cvalue, uint8_t *utf8bytes)
{
register int i, j;
if (cvalue > 0x7fffffffu)
  return -1;
for (i = 0; i < utf8_table1_size; i++)
  if (cvalue <= (uint32_t)utf8_table1[i]) break;
utf8bytes += i;
for (j = i; j > 0; j--)
 {
 *utf8bytes-- = 0x80 | (cvalue & 0x3f);
 cvalue >>= 6;
 }
*utf8bytes = utf8_table2[i] | cvalue;
return i + 1;
}